

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Abc_NtkPrintFanoutProfileVec(Abc_Obj_t *pObj,Vec_Ptr_t *vFanouts)

{
  int iVar1;
  Abc_Obj_t *pNode;
  void *pvVar2;
  long lVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  
  printf("Fanout profile (%d):\n",(ulong)(uint)vFanouts->nSize);
  if (0 < vFanouts->nSize) {
    uVar9 = 0;
    do {
      pNode = (Abc_Obj_t *)vFanouts->pArray[uVar9];
      iVar1 = pNode->Id;
      lVar7 = (long)iVar1;
      if (lVar7 < 0) {
LAB_00458d81:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      pvVar2 = pNode->pNtk->pBSMan;
      lVar3 = *(long *)((long)pvVar2 + 0x40);
      if ((*(int *)(lVar3 + 4) <= iVar1) ||
         (lVar4 = *(long *)((long)pvVar2 + 0x38), *(int *)(lVar4 + 4) <= iVar1)) goto LAB_00458d81;
      printf("%3d : time = %7.2f ps   load = %7.2f ff  ",
             (double)*(float *)(*(long *)(lVar3 + 8) + lVar7 * 4),
             (double)*(float *)(*(long *)(lVar4 + 8) + lVar7 * 4),uVar9 & 0xffffffff);
      if (pObj->pNtk->vPhases != (Vec_Int_t *)0x0) {
        pcVar8 = " ";
        if ((pObj->vFanouts).nSize == vFanouts->nSize) {
          uVar6 = Abc_NodeFindFanin(pNode,pObj);
          pVVar5 = pNode->pNtk->vPhases;
          if (pVVar5 == (Vec_Int_t *)0x0) {
            pcVar8 = "p->pNtk->vPhases";
LAB_00458dcf:
            __assert_fail(pcVar8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x18a,"int Abc_ObjFaninPhase(Abc_Obj_t *, int)");
          }
          if (((int)uVar6 < 0) || ((pNode->vFanins).nSize <= (int)uVar6)) {
            pcVar8 = "i >= 0 && i < Abc_ObjFaninNum(p)";
            goto LAB_00458dcf;
          }
          iVar1 = pNode->Id;
          if (((long)iVar1 < 0) || (pVVar5->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pcVar8 = "*";
          if (((uint)pVVar5->pArray[iVar1] >> (uVar6 & 0x1f) & 1) == 0) {
            pcVar8 = " ";
          }
        }
        printf("%s",pcVar8);
      }
      putchar(10);
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)vFanouts->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_NtkPrintFanoutProfileVec( Abc_Obj_t * pObj, Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pFanout;
    int i;
    printf( "Fanout profile (%d):\n", Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
    {
        printf( "%3d : time = %7.2f ps   load = %7.2f ff  ", i, Bus_SclObjETime(pFanout), Bus_SclObjCin(pFanout) );
        if ( pObj->pNtk->vPhases )
            printf( "%s", (pObj && Abc_ObjFanoutNum(pObj) == Vec_PtrSize(vFanouts) && Abc_ObjFaninPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) )) ? "*" : " " );
        printf( "\n" );
    }
    printf( "\n" );
}